

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SettingsUI.cpp
# Opt level: O1

bool LTSettingsUI::ToggleDisplay(int _force)

{
  bool bVar1;
  LTSettingsUI *this;
  
  if (_force == 0) {
    if (gpSettings == (LTSettingsUI *)0x0) {
      _force = 1;
    }
    else {
      bVar1 = ImgWindow::GetVisible((ImgWindow *)gpSettings);
      _force = -(uint)bVar1 | 1;
    }
  }
  if (_force < 1) {
    if (gpSettings != (LTSettingsUI *)0x0) {
      (*(gpSettings->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[1])();
    }
  }
  else {
    if (gpSettings == (LTSettingsUI *)0x0) {
      this = (LTSettingsUI *)operator_new(0x618);
      LTSettingsUI(this);
      gpSettings = this;
    }
    (*(gpSettings->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[2])(gpSettings,1);
    XPLMBringWindowToFront((gpSettings->super_LTImgWindow).super_ImgWindow.mWindowID);
  }
  return 0 < _force;
}

Assistant:

bool LTSettingsUI::ToggleDisplay (int _force)
{
    // If we toggle then do what current is not the state
    if (!_force)
        _force = LTSettingsUI::IsDisplayed() ? -1 : 1;
    
    // Open the window?
    if (_force > 0)
    {
        // Create the object and window if needed
        if (!gpSettings)
            gpSettings = new LTSettingsUI();
        // Ensure it is visible and centered
        gpSettings->SetVisible(true);
        gpSettings->BringWindowToFront();
        return true;                    // visible now
    }
    // Close the window
    else
    {
        if (gpSettings)                 // just remove the object
            delete gpSettings;          // (constructor clears gpSettings)
        return false;                   // not visible
    }
}